

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah_spatial.cpp
# Opt level: O2

void __thiscall
embree::avx::
BVHNBuilderFastSpatialSAH<8,_embree::TriangleMesh,_embree::TriangleM<4>,_embree::avx::TriangleSplitterFactory>
::build(BVHNBuilderFastSpatialSAH<8,_embree::TriangleMesh,_embree::TriangleM<4>,_embree::avx::TriangleSplitterFactory>
        *this)

{
  size_t *psVar1;
  mvector<PrimRef> *prims;
  undefined8 *puVar2;
  undefined8 *puVar3;
  char cVar4;
  BVH *pBVar5;
  pointer ppTVar6;
  PrimRef *pPVar7;
  MemoryMonitorInterface *pMVar8;
  Geometry *pGVar9;
  BVHN<8> *this_00;
  double dVar10;
  float fVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  bool bVar15;
  long lVar16;
  TriangleMesh *pTVar17;
  Scene *pSVar18;
  ulong uVar19;
  PrimRef *pPVar20;
  size_t sVar21;
  NodeRef root;
  ulong uVar22;
  size_t i_1;
  size_t i;
  char *__rhs;
  EVP_PKEY_CTX *ctx;
  pointer ppTVar23;
  ulong uVar24;
  ulong uVar25;
  size_t sVar26;
  uint ret;
  uint uVar27;
  double t0;
  BuildProgressMonitor *in_stack_fffffffffffffe68;
  BuildProgressMonitor *in_stack_fffffffffffffe70;
  PrimInfo pinfo;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_88;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_68;
  size_t local_58;
  size_t sStack_50;
  undefined **local_40;
  Scene *local_38;
  
  pTVar17 = this->mesh;
  if (pTVar17 == (TriangleMesh *)0x0) {
LAB_00c77fd2:
    sVar21 = (this->scene->world).numTriangles;
    this->numPreviousPrimitives = (uint)sVar21;
    if (sVar21 == 0) goto LAB_00c78035;
    pSVar18 = this->scene;
    uVar27 = 0;
    for (sVar26 = 0; (pSVar18->geometries).size_active != sVar26; sVar26 = sVar26 + 1) {
      pGVar9 = (pSVar18->geometries).items[sVar26].ptr;
      if ((((pGVar9 != (Geometry *)0x0) && (((uint)pGVar9->field_8 & 0x2000ff) == 0x200014)) &&
          (pGVar9->numTimeSteps == 1)) && (uVar27 <= (uint)sVar26)) {
        uVar27 = (uint)sVar26;
      }
    }
    bVar15 = true;
  }
  else {
    if ((pTVar17->super_Geometry).numPrimitives != this->numPreviousPrimitives) {
      pBVar5 = this->bvh;
      FastAllocator::internal_fix_used_blocks(&pBVar5->alloc);
      ppTVar6 = (pBVar5->alloc).thread_local_allocators.
                super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppTVar23 = (pBVar5->alloc).thread_local_allocators.
                      super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppTVar23 != ppTVar6;
          ppTVar23 = ppTVar23 + 1) {
        FastAllocator::ThreadLocal2::unbind(*ppTVar23,&pBVar5->alloc);
      }
      ppTVar23 = (pBVar5->alloc).thread_local_allocators.
                 super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((pBVar5->alloc).thread_local_allocators.
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppTVar23) {
        (pBVar5->alloc).thread_local_allocators.
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppTVar23;
      }
      LOCK();
      (pBVar5->alloc).bytesUsed.super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      LOCK();
      (pBVar5->alloc).bytesFree.super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      LOCK();
      (pBVar5->alloc).bytesWasted.super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      if ((pBVar5->alloc).usedBlocks._M_b._M_p != (__pointer_type)0x0) {
        FastAllocator::Block::clear_list
                  ((pBVar5->alloc).usedBlocks._M_b._M_p,(pBVar5->alloc).device,
                   (pBVar5->alloc).useUSM);
      }
      LOCK();
      (pBVar5->alloc).usedBlocks._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      if ((pBVar5->alloc).freeBlocks._M_b._M_p != (__pointer_type)0x0) {
        FastAllocator::Block::clear_list
                  ((pBVar5->alloc).freeBlocks._M_b._M_p,(pBVar5->alloc).device,
                   (pBVar5->alloc).useUSM);
      }
      LOCK();
      (pBVar5->alloc).freeBlocks._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      for (lVar16 = -0x40; lVar16 != 0; lVar16 = lVar16 + 8) {
        LOCK();
        *(undefined8 *)((long)&(pBVar5->alloc).threadBlocks[0]._M_b._M_p + lVar16) = 0;
        UNLOCK();
        LOCK();
        *(undefined8 *)((long)&(pBVar5->alloc).threadBlocks[8]._M_b._M_p + lVar16) = 0;
        UNLOCK();
      }
      sVar21 = (pBVar5->alloc).primrefarray.size_alloced;
      pPVar7 = (pBVar5->alloc).primrefarray.items;
      if (pPVar7 != (PrimRef *)0x0) {
        if (sVar21 << 5 < 0x1c00000) {
          alignedFree(pPVar7);
        }
        else {
          os_free(pPVar7,sVar21 << 5,(pBVar5->alloc).primrefarray.alloc.hugepages);
        }
      }
      if (sVar21 != 0) {
        pMVar8 = (pBVar5->alloc).primrefarray.alloc.device;
        (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,sVar21 * -0x20,1);
      }
      (pBVar5->alloc).primrefarray.items = (PrimRef *)0x0;
      (pBVar5->alloc).primrefarray.size_active = 0;
      (pBVar5->alloc).primrefarray.size_alloced = 0;
      pTVar17 = this->mesh;
      if (pTVar17 == (TriangleMesh *)0x0) goto LAB_00c77fd2;
    }
    uVar27 = (pTVar17->super_Geometry).numPrimitives;
    sVar21 = (size_t)uVar27;
    this->numPreviousPrimitives = uVar27;
    if (sVar21 == 0) {
LAB_00c78035:
      sVar21 = (this->prims0).size_alloced;
      pPVar7 = (this->prims0).items;
      if (pPVar7 != (PrimRef *)0x0) {
        if (sVar21 << 5 < 0x1c00000) {
          alignedFree(pPVar7);
        }
        else {
          os_free(pPVar7,sVar21 << 5,(this->prims0).alloc.hugepages);
        }
      }
      if (sVar21 != 0) {
        pMVar8 = (this->prims0).alloc.device;
        (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,sVar21 * -0x20,1);
      }
      (this->prims0).items = (PrimRef *)0x0;
      (this->prims0).size_active = 0;
      (this->prims0).size_alloced = 0;
      (*(this->bvh->super_AccelData).super_RefCount._vptr_RefCount[5])();
      return;
    }
    uVar27 = this->geomID_;
    pSVar18 = this->scene;
    bVar15 = false;
  }
  cVar4 = *(char *)(*(long *)&(pSVar18->super_AccelN).field_0x188 + 0x464);
  this_00 = this->bvh;
  if (bVar15) {
    std::__cxx11::to_string(&local_b8,8);
    std::operator+(&local_d8,"avx::BVH",&local_b8);
    __rhs = "BuilderFastSpatialSAH";
    if (0x7ffffff < uVar27 || cVar4 != '\0') {
      __rhs = "BuilderFastSpatialPresplitSAH";
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pinfo,
                   &local_d8,__rhs);
  }
  else {
    std::__cxx11::string::string((string *)&pinfo,"",(allocator *)&local_d8);
  }
  t0 = BVHN<8>::preBuild(this_00,(string *)&pinfo);
  std::__cxx11::string::~string((string *)&pinfo);
  if (bVar15) {
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  fVar11 = (float)sVar21 * this->splitFactor;
  uVar19 = (ulong)fVar11;
  uVar19 = (long)(fVar11 - 9.223372e+18) & (long)uVar19 >> 0x3f | uVar19;
  if (uVar19 < sVar21) {
    uVar19 = sVar21;
  }
  uVar22 = (this->prims0).size_alloced;
  uVar25 = uVar22;
  if ((uVar22 < uVar19) && (uVar24 = uVar22, uVar25 = uVar19, uVar22 != 0)) {
    for (; uVar25 = uVar24, uVar24 < uVar19; uVar24 = uVar24 * 2 + (ulong)(uVar24 * 2 == 0)) {
    }
  }
  psVar1 = &(this->prims0).size_active;
  if (uVar19 < (this->prims0).size_active) {
    *psVar1 = uVar19;
  }
  prims = &this->prims0;
  if (uVar22 == uVar25) {
    *psVar1 = uVar19;
    goto LAB_00c7830d;
  }
  pPVar7 = (this->prims0).items;
  if (uVar25 == 0) {
    sVar26 = 0;
LAB_00c78275:
    pPVar20 = (PrimRef *)alignedMalloc(sVar26,0x20);
  }
  else {
    pMVar8 = (prims->alloc).device;
    sVar26 = uVar25 << 5;
    (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,sVar26,0);
    if (sVar26 < 0x1c00000) goto LAB_00c78275;
    pPVar20 = (PrimRef *)os_malloc(sVar26,&(this->prims0).alloc.hugepages);
  }
  (this->prims0).items = pPVar20;
  lVar16 = 0;
  for (uVar22 = 0; uVar22 < *psVar1; uVar22 = uVar22 + 1) {
    puVar2 = (undefined8 *)((long)&(pPVar7->lower).field_0 + lVar16);
    uVar12 = puVar2[1];
    uVar13 = puVar2[2];
    uVar14 = puVar2[3];
    puVar3 = (undefined8 *)((long)&(((this->prims0).items)->lower).field_0 + lVar16);
    *puVar3 = *puVar2;
    puVar3[1] = uVar12;
    puVar3[2] = uVar13;
    puVar3[3] = uVar14;
    lVar16 = lVar16 + 0x20;
  }
  sVar26 = (this->prims0).size_alloced;
  if (pPVar7 != (PrimRef *)0x0) {
    if (sVar26 << 5 < 0x1c00000) {
      alignedFree(pPVar7);
    }
    else {
      os_free(pPVar7,sVar26 << 5,(this->prims0).alloc.hugepages);
    }
  }
  if (sVar26 != 0) {
    pMVar8 = (prims->alloc).device;
    (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,sVar26 * -0x20,1);
  }
  (this->prims0).size_active = uVar19;
  (this->prims0).size_alloced = uVar25;
LAB_00c7830d:
  if (this->mesh != (TriangleMesh *)0x0) {
    (this->bvh->alloc).atype = EMBREE_OS_MALLOC;
  }
  if (0x7ffffff < uVar27 || cVar4 != '\0') {
    if (this->mesh == (TriangleMesh *)0x0) {
      createPrimRefArray_presplit<embree::TriangleMesh,embree::avx::TriangleSplitterFactory>
                ((PrimInfo *)&local_98.field_1,(avx *)this->scene,(Scene *)&Geometry::updateBuffer,
                 ~MTY_ALL,SUB81(sVar21,0),(size_t)prims,
                 (mvector<PrimRef> *)&this->bvh->scene->progressInterface,in_stack_fffffffffffffe70)
      ;
    }
    else {
      createPrimRefArray_presplit<embree::TriangleMesh,embree::avx::TriangleSplitterFactory>
                ((PrimInfo *)&local_98.field_1,(avx *)this->mesh,(Geometry *)(ulong)uVar27,
                 (uint)sVar21,(size_t)prims,(mvector<PrimRef> *)&this->bvh->scene->progressInterface
                 ,in_stack_fffffffffffffe68);
    }
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_ =
         local_98._0_8_;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_ =
         local_98._8_8_;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_ =
         aStack_88._0_8_;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_ =
         aStack_88._8_8_;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
         local_78._0_8_;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
         local_78._8_8_;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
         aStack_68._0_8_;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
         aStack_68._8_8_;
    pinfo.begin = local_58;
    pinfo.end = sStack_50;
    dVar10 = (double)((sStack_50 - local_58) + 3 >> 2) * 1.2 * 176.0;
    uVar19 = (ulong)dVar10;
    sVar21 = ((long)(dVar10 - 9.223372036854776e+18) & (long)uVar19 >> 0x3f | uVar19) +
             (sStack_50 - local_58 & 0xffffffffffffff) * 8;
    FastAllocator::init_estimate(&this->bvh->alloc,sVar21);
    sVar21 = FastAllocator::fixSingleThreadThreshold
                       (&this->bvh->alloc,8,0x400,pinfo.end - pinfo.begin,sVar21);
    (this->settings).singleThreadThreshold = sVar21;
    (this->settings).branchingFactor = 8;
    (this->settings).maxDepth = 0x28;
    local_98._8_8_ = this->bvh;
    local_98._0_8_ = &PTR_createLeaf_021e7518;
    root.ptr = (size_t)BVHNBuilderVirtual<8>::BVHNBuilderV::build
                                 ((BVHNBuilderV *)&local_98.field_1,&((BVH *)local_98._8_8_)->alloc,
                                  &(((BVH *)local_98._8_8_)->scene->progressInterface).
                                   super_BuildProgressMonitor,(this->prims0).items,&pinfo,
                                  this->settings);
  }
  else {
    if (this->mesh == (TriangleMesh *)0x0) {
      avx::createPrimRefArray
                ((PrimInfo *)&local_98.field_1,this->scene,MTY_TRIANGLE_MESH,false,uVar19,prims,
                 &(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
    }
    else {
      avx::createPrimRefArray
                ((PrimInfo *)&local_98.field_1,&this->mesh->super_Geometry,this->geomID_,uVar19,
                 prims,&(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
    }
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_ =
         local_98._0_8_;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_ =
         local_98._8_8_;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_ =
         aStack_88._0_8_;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_ =
         aStack_88._8_8_;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
         local_78._0_8_;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
         local_78._8_8_;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
         aStack_68._0_8_;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
         aStack_68._8_8_;
    pinfo.begin = local_58;
    pinfo.end = sStack_50;
    pSVar18 = this->scene;
    dVar10 = (double)((sStack_50 - local_58) + 3 >> 2) * 1.2 * 176.0;
    uVar22 = (ulong)dVar10;
    sVar21 = ((long)(dVar10 - 9.223372036854776e+18) & (long)uVar22 >> 0x3f | uVar22) +
             (sStack_50 - local_58 & 0xffffffffffffff) * 8;
    FastAllocator::init_estimate(&this->bvh->alloc,sVar21);
    sVar21 = FastAllocator::fixSingleThreadThreshold
                       (&this->bvh->alloc,8,0x400,pinfo.end - pinfo.begin,sVar21);
    (this->settings).singleThreadThreshold = sVar21;
    (this->settings).branchingFactor = 8;
    (this->settings).maxDepth = 0x28;
    local_98._0_8_ = this->bvh;
    local_40 = &PTR_operator___021d4948;
    local_38 = (((BVH *)local_98._0_8_)->scene->progressInterface).scene;
    root.ptr = (size_t)BVHBuilderBinnedFastSpatialSAH::
                       build<embree::NodeRefPtr<8>,embree::BVHN<8>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<8>,8>::Create2,embree::AABBNode_t<embree::NodeRefPtr<8>,8>::Set2,embree::avx::CreateLeafSpatial<8,embree::TriangleM<4>>,embree::avx::TriangleSplitterFactory,embree::Scene::BuildProgressMonitorInterface>
                                 (&((BVH *)local_98._0_8_)->alloc,&local_98,pSVar18,&local_40,
                                  (this->prims0).items,uVar19,&pinfo,&this->settings);
  }
  local_98._0_8_ =
       pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_;
  local_98._8_8_ =
       pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_;
  aStack_88._0_8_ =
       pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_;
  aStack_88._8_8_ =
       pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_;
  local_78._0_8_ =
       pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_;
  local_78._8_8_ =
       pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_;
  aStack_68._0_8_ =
       pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_;
  aStack_68._8_8_ =
       pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_;
  BVHN<8>::set(this->bvh,root,(LBBox3fa *)&local_98.field_1,pinfo.end - pinfo.begin);
  fVar11 = (float)(pinfo.end - pinfo.begin) * 0.005;
  uVar19 = (ulong)fVar11;
  ctx = (EVP_PKEY_CTX *)((long)(fVar11 - 9.223372e+18) & (long)uVar19 >> 0x3f | uVar19);
  BVHN<8>::layoutLargeNodes(this->bvh,(size_t)ctx);
  if ((this->scene != (Scene *)0x0) &&
     ((this->scene->scene_flags & RTC_SCENE_FLAG_DYNAMIC) == RTC_SCENE_FLAG_NONE)) {
    sVar21 = (this->prims0).size_alloced;
    pPVar7 = (this->prims0).items;
    if (pPVar7 != (PrimRef *)0x0) {
      ctx = (EVP_PKEY_CTX *)(sVar21 << 5);
      if (ctx < (EVP_PKEY_CTX *)0x1c00000) {
        alignedFree(pPVar7);
      }
      else {
        os_free(pPVar7,(size_t)ctx,(this->prims0).alloc.hugepages);
      }
    }
    if (sVar21 != 0) {
      pMVar8 = (prims->alloc).device;
      ctx = (EVP_PKEY_CTX *)(sVar21 * -0x20);
      (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,ctx,1);
    }
    *psVar1 = 0;
    (this->prims0).size_alloced = 0;
    (this->prims0).items = (PrimRef *)0x0;
  }
  BVHN<8>::cleanup(this->bvh,ctx);
  BVHN<8>::postBuild(this->bvh,t0);
  return;
}

Assistant:

void build()
      {
        /* we reset the allocator when the mesh size changed */
        if (mesh && mesh->numPrimitives != numPreviousPrimitives) {
          bvh->alloc.clear();
        }

	/* skip build for empty scene */
        const size_t numOriginalPrimitives = mesh ? mesh->size() : scene->getNumPrimitives(Mesh::geom_type,false);
        numPreviousPrimitives = numOriginalPrimitives;
        if (numOriginalPrimitives == 0) {
          prims0.clear();
          bvh->clear();
          return;
        }

        const unsigned int maxGeomID = mesh ? geomID_ : scene->getMaxGeomID<Mesh,false>();
        const bool usePreSplits = scene->device->useSpatialPreSplits || (maxGeomID >= ((unsigned int)1 << (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS)));
        double t0 = bvh->preBuild(mesh ? "" : TOSTRING(isa) "::BVH" + toString(N) + (usePreSplits ? "BuilderFastSpatialPresplitSAH" : "BuilderFastSpatialSAH"));

        /* create primref array */
        const size_t numSplitPrimitives = max(numOriginalPrimitives,size_t(splitFactor*numOriginalPrimitives));
        prims0.resize(numSplitPrimitives);

        /* enable os_malloc for two level build */
        if (mesh)
          bvh->alloc.setOSallocation(true);
	
	NodeRef root(0);
	PrimInfo pinfo;
	

        if (likely(usePreSplits))
	  {		     
            /* spatial presplit SAH BVH builder */
	    pinfo = mesh ?
	      createPrimRefArray_presplit<Mesh,Splitter>(mesh,maxGeomID,numOriginalPrimitives,prims0,bvh->scene->progressInterface) :
	      createPrimRefArray_presplit<Mesh,Splitter>(scene,Mesh::geom_type,false,numOriginalPrimitives,prims0,bvh->scene->progressInterface);

	    const size_t node_bytes = pinfo.size()*sizeof(typename BVH::AABBNode)/(4*N);
	    const size_t leaf_bytes = size_t(1.2*Primitive::blocks(pinfo.size())*sizeof(Primitive));
	    bvh->alloc.init_estimate(node_bytes+leaf_bytes);
	    settings.singleThreadThreshold = bvh->alloc.fixSingleThreadThreshold(N,DEFAULT_SINGLE_THREAD_THRESHOLD,pinfo.size(),node_bytes+leaf_bytes);

	    settings.branchingFactor = N;
	    settings.maxDepth = BVH::maxBuildDepthLeaf;

	    /* call BVH builder */
	    root = BVHNBuilderVirtual<N>::build(&bvh->alloc,CreateLeafSpatial<N,Primitive>(bvh),bvh->scene->progressInterface,prims0.data(),pinfo,settings);
	  }
	else
	  {
            /* standard spatial split SAH BVH builder */
	    pinfo = mesh ?
	      createPrimRefArray(mesh,geomID_,numSplitPrimitives,prims0,bvh->scene->progressInterface) :
	      createPrimRefArray(scene,Mesh::geom_type,false,numSplitPrimitives,prims0,bvh->scene->progressInterface);
	
	    Splitter splitter(scene);

	    const size_t node_bytes = pinfo.size()*sizeof(typename BVH::AABBNode)/(4*N);
	    const size_t leaf_bytes = size_t(1.2*Primitive::blocks(pinfo.size())*sizeof(Primitive));
	    bvh->alloc.init_estimate(node_bytes+leaf_bytes);
	    settings.singleThreadThreshold = bvh->alloc.fixSingleThreadThreshold(N,DEFAULT_SINGLE_THREAD_THRESHOLD,pinfo.size(),node_bytes+leaf_bytes);

	    settings.branchingFactor = N;
	    settings.maxDepth = BVH::maxBuildDepthLeaf;

	    /* call BVH builder */
	    root = BVHBuilderBinnedFastSpatialSAH::build<NodeRef>(
								  typename BVH::CreateAlloc(bvh),
								  typename BVH::AABBNode::Create2(),
								  typename BVH::AABBNode::Set2(),
								  CreateLeafSpatial<N,Primitive>(bvh),
								  splitter,
								  bvh->scene->progressInterface,
								  prims0.data(),
								  numSplitPrimitives,
								  pinfo,settings);

	    /* ==================== */
	  }

        bvh->set(root,LBBox3fa(pinfo.geomBounds),pinfo.size());
        bvh->layoutLargeNodes(size_t(pinfo.size()*0.005f));

	/* clear temporary data for static geometry */
	if (scene && scene->isStaticAccel()) {
          prims0.clear();
        }
	bvh->cleanup();
        bvh->postBuild(t0);
      }